

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string asStack_7c8 [32];
  ExttposeArgument local_7a8;
  result_t local_660;
  Env env;
  
  Env::Env(&env);
  local_7a8.input._M_dataplus._M_p = (pointer)&local_7a8.input.field_2;
  local_7a8.input._M_string_length = 0;
  local_7a8.input.field_2._M_local_buf[0] = '\0';
  local_7a8.output._M_dataplus._M_p = (pointer)&local_7a8.output.field_2;
  local_7a8.output._M_string_length = 0;
  local_7a8.output.field_2._M_local_buf[0] = '\0';
  local_7a8.idxfn._M_dataplus._M_p = (pointer)&local_7a8.idxfn.field_2;
  local_7a8.idxfn._M_string_length = 0;
  local_7a8.idxfn.field_2._M_local_buf[0] = '\0';
  local_7a8.inconfn._M_dataplus._M_p = (pointer)&local_7a8.inconfn.field_2;
  local_7a8.inconfn._M_string_length = 0;
  local_7a8.inconfn.field_2._M_local_buf[0] = '\0';
  local_7a8.it2fn._M_dataplus._M_p = (pointer)&local_7a8.it2fn.field_2;
  local_7a8.it2fn._M_string_length = 0;
  local_7a8.it2fn.field_2._M_local_buf[0] = '\0';
  local_7a8.seqfn._M_dataplus._M_p = (pointer)&local_7a8.seqfn.field_2;
  local_7a8.seqfn._M_string_length = 0;
  local_7a8.seqfn.field_2._M_local_buf[0] = '\0';
  local_7a8.tmpfn._M_dataplus._M_p = (pointer)&local_7a8.tmpfn.field_2;
  local_7a8.tmpfn._M_string_length = 0;
  local_7a8.tmpfn.field_2._M_local_buf[0] = '\0';
  local_7a8.MINSUP_PER = 0.0;
  local_7a8.do_invert = 1;
  local_7a8.do_l2 = 1;
  local_7a8.use_seq = 1;
  local_7a8.write_only_fcnt = 1;
  local_7a8.use_newformat = '\x01';
  local_7a8.num_partitions = 1;
  local_7a8.no_minus_off = '\0';
  local_7a8.use_diff = '\0';
  local_7a8.DBASE_AVG_CUST_SZ = 0.0;
  local_7a8.AMEM = 0x25a0000;
  local_7a8.name._M_dataplus._M_p = (pointer)&local_7a8.name.field_2;
  local_7a8.name._M_string_length = 0;
  local_7a8.name.field_2._M_local_buf[0] = '\0';
  ExttposeArgument::parse_args(&local_7a8,argc,argv);
  exttposeFunc(&local_660,&env,&local_7a8);
  result_t::~result_t(&local_660);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_7c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_7c8);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_7c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_7c8);
  ExttposeArgument::~ExttposeArgument(&local_7a8);
  Env::~Env(&env);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    try {
        Env env;
        ExttposeArgument args;
        args.parse_args(argc, argv);
        exttposeFunc(env, args);
        cout << env.logger.str() << endl;
        cout << env.summary.str() << endl;
        return 0;
    }
    catch (exception &e) {
        cerr << "exttpose: Caught exception: " << e.what() << endl;
    }
    catch (...) {
        cerr << "exttpose: Caught unknown exception" << endl;
    }
    return 1;
}